

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerGLSL::emit_pls(CompilerGLSL *this)

{
  bool bVar1;
  SPIREntryPoint *pSVar2;
  CompilerError *pCVar3;
  undefined1 local_a8 [40];
  PlsRemap *output;
  iterator __end2_1;
  iterator __begin2_1;
  vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> *__range2_1;
  reference local_48;
  PlsRemap *input;
  iterator __end2;
  iterator __begin2;
  vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> *__range2;
  SPIREntryPoint *execution;
  CompilerGLSL *this_local;
  
  pSVar2 = Compiler::get_entry_point(&this->super_Compiler);
  if (pSVar2->model != ExecutionModelFragment) {
    pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar3,"Pixel local storage only supported in fragment shaders.");
    __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  if (((this->options).es & 1U) == 0) {
    pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar3,"Pixel local storage only supported in OpenGL ES.");
    __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  if ((this->options).version < 300) {
    pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar3,"Pixel local storage only supported in ESSL 3.0 and above.")
    ;
    __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  bVar1 = ::std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::empty
                    (&this->pls_inputs);
  if (!bVar1) {
    statement<char_const(&)[27]>(this,(char (*) [27])"__pixel_local_inEXT _PLSIn");
    begin_scope(this);
    __end2 = ::std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::begin
                       (&this->pls_inputs);
    input = (PlsRemap *)
            ::std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::end
                      (&this->pls_inputs);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<spirv_cross::PlsRemap_*,_std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>_>
                                  *)&input);
      if (!bVar1) break;
      local_48 = __gnu_cxx::
                 __normal_iterator<spirv_cross::PlsRemap_*,_std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>_>
                 ::operator*(&__end2);
      pls_decl_abi_cxx11_((CompilerGLSL *)&__range2_1,(PlsRemap *)this);
      statement<std::__cxx11::string,char_const(&)[2]>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &__range2_1,(char (*) [2])0x42463b);
      ::std::__cxx11::string::~string((string *)&__range2_1);
      __gnu_cxx::
      __normal_iterator<spirv_cross::PlsRemap_*,_std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>_>
      ::operator++(&__end2);
    }
    end_scope_decl(this);
    statement<char_const(&)[1]>(this,(char (*) [1])0x400321);
  }
  bVar1 = ::std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::empty
                    (&this->pls_outputs);
  if (!bVar1) {
    statement<char_const(&)[29]>(this,(char (*) [29])"__pixel_local_outEXT _PLSOut");
    begin_scope(this);
    __end2_1 = ::std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::begin
                         (&this->pls_outputs);
    output = (PlsRemap *)
             ::std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::end
                       (&this->pls_outputs);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2_1,
                         (__normal_iterator<spirv_cross::PlsRemap_*,_std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>_>
                          *)&output);
      if (!bVar1) break;
      local_a8._32_8_ =
           __gnu_cxx::
           __normal_iterator<spirv_cross::PlsRemap_*,_std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>_>
           ::operator*(&__end2_1);
      pls_decl_abi_cxx11_((CompilerGLSL *)local_a8,(PlsRemap *)this);
      statement<std::__cxx11::string,char_const(&)[2]>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                 (char (*) [2])0x42463b);
      ::std::__cxx11::string::~string((string *)local_a8);
      __gnu_cxx::
      __normal_iterator<spirv_cross::PlsRemap_*,_std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>_>
      ::operator++(&__end2_1);
    }
    end_scope_decl(this);
    statement<char_const(&)[1]>(this,(char (*) [1])0x400321);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_pls()
{
	auto &execution = get_entry_point();
	if (execution.model != ExecutionModelFragment)
		SPIRV_CROSS_THROW("Pixel local storage only supported in fragment shaders.");

	if (!options.es)
		SPIRV_CROSS_THROW("Pixel local storage only supported in OpenGL ES.");

	if (options.version < 300)
		SPIRV_CROSS_THROW("Pixel local storage only supported in ESSL 3.0 and above.");

	if (!pls_inputs.empty())
	{
		statement("__pixel_local_inEXT _PLSIn");
		begin_scope();
		for (auto &input : pls_inputs)
			statement(pls_decl(input), ";");
		end_scope_decl();
		statement("");
	}

	if (!pls_outputs.empty())
	{
		statement("__pixel_local_outEXT _PLSOut");
		begin_scope();
		for (auto &output : pls_outputs)
			statement(pls_decl(output), ";");
		end_scope_decl();
		statement("");
	}
}